

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O0

vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> * __thiscall
PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
          (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
           *__return_storage_ptr__,PoissonGenerator *this,uint32_t numPoints,DefaultPRNG *generator,
          bool isCircle,float jitterRadius,Point center)

{
  __type _Var1;
  bool bVar2;
  float fVar3;
  Point *pPVar4;
  undefined4 in_register_00000014;
  float fVar5;
  Point PVar6;
  Point local_c8;
  Point local_bc;
  Point local_b0;
  Point local_9c;
  Point local_90;
  undefined1 local_80 [8];
  Point offs;
  Point p;
  uint32_t y;
  uint32_t x;
  uint32_t gridSize;
  float jitterRadius_local;
  bool isCircle_local;
  DefaultPRNG *generator_local;
  uint32_t numPoints_local;
  float local_28;
  undefined1 local_20 [8];
  Point center_local;
  vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *samplePoints;
  
  local_20 = center._0_8_;
  local_28 = (float)CONCAT31(local_28._1_3_,isCircle);
  center_local.x = local_28;
  unique0x10000267 = __return_storage_ptr__;
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::vector
            (__return_storage_ptr__);
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::reserve
            (__return_storage_ptr__,(ulong)this & 0xffffffff);
  _Var1 = std::sqrt<unsigned_int>((uint)this);
  fVar3 = (float)(long)_Var1;
  p.valid_ = false;
  p._9_3_ = 0;
  for (; (float)p._8_4_ != fVar3; p._8_4_ = p._8_4_ + 1) {
    for (p.y = 0.0; p.y != fVar3; p.y = (float)((int)p.y + 1)) {
      Point::Point((Point *)&offs.y);
      do {
        Point::Point(&local_9c,0.0,0.0);
        PVar6 = generateRandomPointAround<PoissonGenerator::DefaultPRNG>
                          (&local_9c,jitterRadius,
                           (DefaultPRNG *)CONCAT44(in_register_00000014,numPoints));
        local_b0.valid_ = PVar6.valid_;
        local_b0._0_8_ = PVar6._0_8_;
        local_90._0_8_ = local_b0._0_8_;
        local_90.valid_ = local_b0.valid_;
        pPVar4 = Point::operator-(&local_90,(Point *)local_20);
        Point::Point(&local_bc,0.5,0.5);
        pPVar4 = Point::operator+(pPVar4,&local_bc);
        offs.x = *(float *)&pPVar4->valid_;
        local_80._0_4_ = pPVar4->x;
        local_80._4_4_ = pPVar4->y;
        fVar5 = (float)((long)_Var1 & 0xffffffff);
        Point::Point(&local_c8,(float)(uint)p._8_4_ / fVar5,(float)(uint)p.y / fVar5);
        pPVar4 = Point::operator+(&local_c8,(Point *)local_80);
        offs._4_8_ = *(undefined8 *)pPVar4;
        bVar2 = Point::isInRectangle((Point *)&offs.y);
      } while (((bVar2 ^ 0xffU) & 1) != 0);
      if ((((ulong)generator & 1) == 0) || (bVar2 = Point::isInCircle((Point *)&offs.y), bVar2)) {
        std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::push_back
                  (__return_storage_ptr__,(value_type *)&offs.y);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point> generateJitteredGridPoints(uint32_t numPoints,
                                              PRNG& generator,
                                              bool isCircle = false,
                                              float jitterRadius = 0.004f,
                                              Point center = Point(0.5f, 0.5f)) {
  std::vector<Point> samplePoints;

  samplePoints.reserve(numPoints);

  const uint32_t gridSize = uint32_t(sqrt(numPoints));

  for (uint32_t x = 0; x != gridSize; x++) {
    for (uint32_t y = 0; y != gridSize; y++) {
      Point p;
      do {
        const Point offs = generateRandomPointAround(Point(0, 0), jitterRadius, generator) - center + Point(0.5f, 0.5f);
        p = Point(float(x) / gridSize, float(y) / gridSize) + offs;
        // generate a new point until it is within the boundaries
      } while (!p.isInRectangle());

      if (isCircle)
        if (!p.isInCircle())
          continue;

      samplePoints.push_back(p);
    }
  }

  return samplePoints;
}